

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_snode.c
# Opt level: O1

void relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  ifill(relax_end,n,-1);
  uVar6 = (ulong)(uint)n;
  if (0 < n) {
    memset(descendants,0,uVar6 * 4);
    uVar3 = 0;
    do {
      iVar2 = et[uVar3];
      if (iVar2 != n) {
        descendants[iVar2] = descendants[uVar3] + descendants[iVar2] + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  if (0 < n) {
    iVar2 = 0;
    do {
      iVar1 = iVar2;
      for (iVar5 = et[iVar2]; (iVar5 != n && (descendants[iVar5] < relax_columns));
          iVar5 = et[iVar5]) {
        iVar1 = iVar5;
      }
      relax_end[iVar2] = iVar1;
      lVar4 = (long)iVar1;
      iVar2 = iVar1;
      do {
        lVar4 = lVar4 + 1;
        iVar2 = iVar2 + 1;
        if (descendants[lVar4] == 0) break;
      } while (lVar4 < (long)uVar6);
    } while (iVar2 < n);
  }
  return;
}

Assistant:

void
relax_snode (
	     const     int n,
                  const int *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{

    register int j, parent;
    register int snode_start;	/* beginning of a snode */
    
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

    /*printf("No of relaxed snodes: %d; relaxed columns: %d\n", 
		nsuper, no_relaxed_col); */
}